

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.c
# Opt level: O0

void limit_scaling(c_float *D,c_int n)

{
  c_float local_28;
  c_float local_20;
  c_int i;
  c_int n_local;
  c_float *D_local;
  
  for (i = 0; i < n; i = i + 1) {
    if (0.0001 < D[i] || D[i] == 0.0001) {
      local_20 = D[i];
    }
    else {
      local_20 = 1.0;
    }
    D[i] = local_20;
    if (D[i] <= 10000.0) {
      local_28 = D[i];
    }
    else {
      local_28 = 10000.0;
    }
    D[i] = local_28;
  }
  return;
}

Assistant:

void limit_scaling(c_float *D, c_int n) {
  c_int i;

  for (i = 0; i < n; i++) {
    D[i] = D[i] < MIN_SCALING ? 1.0 : D[i];
    D[i] = D[i] > MAX_SCALING ? MAX_SCALING : D[i];
  }
}